

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

int handle_include_path(dmr_C *C,stream *stream,token **list,token *token,int how)

{
  char *__s;
  uint uVar1;
  int iVar2;
  token *ptVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  int flen;
  token *token_00;
  long lVar7;
  char **ppcVar8;
  uint local_40;
  byte local_3c;
  
  ptVar3 = token->next;
  if ((((ulong)ptVar3->pos & 0x3f) != 0x11) || ((ptVar3->field_2).special != 0x3c)) {
    expand_list(C,&token->next);
    ptVar3 = token->next;
    local_40 = 0;
    local_3c = 1;
    if ((((ulong)ptVar3->pos & 0x3f) != 0x11) || ((ptVar3->field_2).special != 0x3c))
    goto LAB_0011d68a;
  }
  local_3c = 0;
  local_40 = 0x3e;
  token = ptVar3;
LAB_0011d68a:
  __s = C->preprocessor_tokenseqbuffer;
  ptVar3 = token->next;
  pcVar6 = __s;
  for (token_00 = ptVar3; token_00 != &dmrC_eof_token_entry_; token_00 = token_00->next) {
    uVar1 = SUB84(token_00->pos,0) & 0x3f;
    if (uVar1 == 0x11) {
      if ((token_00->field_2).special == local_40) break;
LAB_0011d6d6:
      pcVar5 = dmrC_show_token(C,token_00);
    }
    else {
      if (uVar1 != 0xf) goto LAB_0011d6d6;
      pcVar5 = (char *)((long)&((token_00->field_2).ident)->next + 4);
    }
    sVar4 = strlen(pcVar5);
    memcpy(pcVar6,pcVar5,(long)(int)sVar4);
    pcVar6 = pcVar6 + (int)sVar4;
  }
  *pcVar6 = '\0';
  if ((local_3c == 0) &&
     ((((ulong)token_00->pos & 0x3f) != 0x11 || ((token_00->field_2).special != local_40)))) {
    dmrC_sparse_error(C,ptVar3->pos,"expected \'>\' at end of filename");
  }
  sVar4 = strlen(__s);
  flen = (int)sVar4 + 1;
  if (*__s == '/') {
    iVar2 = try_include(C,"",__s,flen,list,C->includepath);
    if (iVar2 == 0) {
LAB_0011d785:
      dmrC_error_die(C,ptVar3->pos,"unable to open \'%s\'",__s);
    }
  }
  else {
    if (how == 2) {
      ppcVar8 = C->includepath;
      C->includepath[0] = "";
    }
    else if (how == 1) {
      ppcVar8 = stream->next_path;
    }
    else {
      pcVar6 = stream->path;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = stream->name;
        pcVar5 = strrchr(pcVar6,0x2f);
        if (pcVar5 == (char *)0x0) {
          pcVar6 = "";
        }
        else {
          lVar7 = (ulong)(uint)((int)pcVar5 - (int)pcVar6) << 0x20;
          pcVar6 = (char *)dmrC_allocator_allocate(&C->byte_allocator,lVar7 + 0x200000000 >> 0x20);
          sVar4 = lVar7 + 0x100000000 >> 0x20;
          memcpy(pcVar6,stream->name,sVar4);
          pcVar6[sVar4] = '\0';
        }
        stream->path = pcVar6;
      }
      C->includepath[0] = pcVar6;
      ppcVar8 = *(char ***)(C->date_buffer + (ulong)(local_3c ^ 1) * 8 + -0x28);
    }
    do {
      if (*ppcVar8 == (char *)0x0) goto LAB_0011d785;
      iVar2 = try_include(C,*ppcVar8,__s,flen,list,ppcVar8 + 1);
      ppcVar8 = ppcVar8 + 1;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static int handle_include_path(struct dmr_C *C, struct stream *stream, struct token **list, struct token *token, int how)
{
	const char *filename;
	struct token *next;
	const char **path;
	int expect;
	int flen;

	next = token->next;
	expect = '>';
	if (!dmrC_match_op(next, '<')) {
		expand_list(C, &token->next);
		expect = 0;
		next = token;
		if (dmrC_match_op(token->next, '<')) {
			next = token->next;
			expect = '>';
		}
	}

	token = next->next;
	filename = token_name_sequence(C, token, expect, token);
	flen = (int)strlen(filename) + 1;

	/* Absolute path? */
	if (filename[0] == '/') {
		if (try_include(C, "", filename, flen, list, C->includepath))
			return 0;
		goto out;
	}

	switch (how) {
	case 1:
		path = stream->next_path;
		break;
	case 2:
		C->includepath[0] = "";
		path = C->includepath;
		break;
	default:
		/* Dir of input file is first dir to search for quoted includes */
		set_stream_include_path(C, stream);
		path = expect ? C->angle_includepath : C->quote_includepath;
		break;
	}
	/* Check the standard include paths.. */
	if (do_include_path(C, path, list, token, filename, flen))
		return 0;
out:
	dmrC_error_die(C, token->pos, "unable to open '%s'", filename);
	return 0;
}